

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O2

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
          (Matrix<float,(unsigned_char)3,(unsigned_char)3> *this,double Value)

{
  Matrix<float,(unsigned_char)3,(unsigned_char)3> *pMVar1;
  KUINT16 i;
  long lVar2;
  KUINT16 j;
  long lVar3;
  
  pMVar1 = this;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      *(float *)(this + lVar3 * 4) = (float)((double)*(float *)(this + lVar3 * 4) * Value);
    }
    this = this + 0xc;
  }
  return (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)pMVar1;
}

Assistant:

Matrix & operator *= ( const T Value )
    {
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                Data[i][j] *= Value;
            }
        }

        return *this;
    }